

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_allocator.h
# Opt level: O0

void density::detail::PageAllocator<density::detail::SystemPageManager<256UL>_>::unpin_page
               (void *i_address)

{
  __int_type _Var1;
  PageAllocator<density::detail::SystemPageManager<256UL>_> *this;
  PageFooter *pPVar2;
  atomic<unsigned_long> *paVar3;
  __int_type prev_pins;
  PageFooter *footer;
  void *i_address_local;
  
  this = (PageAllocator<density::detail::SystemPageManager<256UL>_> *)
         PageAllocator<density::detail::SystemPageManager<256ul>>::t_instance();
  process_pending_unpins(this,progress_lock_free);
  pPVar2 = get_footer(i_address);
  paVar3 = &pPVar2->m_pin_count;
  LOCK();
  _Var1 = (paVar3->super___atomic_base<unsigned_long>)._M_i;
  (paVar3->super___atomic_base<unsigned_long>)._M_i =
       (paVar3->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  if (_Var1 == 0) {
    density_tests::detail::assert_failed<>
              ("prev_pins > 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/page_allocator.h"
               ,0xf9);
  }
  return;
}

Assistant:

static void unpin_page(void * const i_address) noexcept
            {
                t_instance.process_pending_unpins(progress_lock_free);

                auto const footer    = get_footer(i_address);
                auto const prev_pins = footer->m_pin_count.fetch_sub(1, detail::mem_relaxed);
                DENSITY_ASSERT(prev_pins > 0);
                (void)prev_pins;
            }